

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdmath.cpp
# Opt level: O0

SQInteger math_max(HSQUIRRELVM v)

{
  SQInteger SVar1;
  HSQUIRRELVM in_stack_00000038;
  
  SVar1 = math_min_max<1l>(in_stack_00000038);
  return SVar1;
}

Assistant:

static SQInteger math_max(HSQUIRRELVM v)
{
  return math_min_max<+1>(v);
}